

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::Person::MergeFrom(Person *this,Person *from)

{
  uint uVar1;
  LogMessage *pLVar2;
  Container<google::protobuf::UnknownFieldSet> *pCVar3;
  string *psVar4;
  undefined1 *this_00;
  LogFinisher local_cd;
  uint32 cached_has_bits;
  byte local_b9;
  LogMessage local_b8 [56];
  Person *local_80;
  Person *from_local;
  Person *this_local;
  undefined1 *local_68;
  undefined4 local_4c;
  HasBits<1UL> *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  UnknownFieldSet *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  local_b9 = 0;
  local_80 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O0/proto/messages.pb.cc"
               ,0x2f0);
    local_b9 = 1;
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_b8,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_cd,pLVar2);
  }
  if ((local_b9 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(local_b8);
  }
  this_00 = &this->field_0x8;
  this_local = (Person *)&local_80->field_0x8;
  local_68 = this_00;
  local_40 = (undefined1 *)this_local;
  local_10 = (undefined1 *)this_local;
  if (((uint)*(undefined8 *)this_local & 1) == 1) {
    local_38 = 0;
    local_30 = (undefined1 *)this_local;
    local_20 = (undefined1 *)this_local;
    local_18 = (undefined1 *)this_local;
    if (((uint)*(undefined8 *)this_local & 1) == 1) {
      pCVar3 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_local);
      local_28 = &pCVar3->unknown_fields;
    }
    else {
      local_28 = (UnknownFieldSet *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)this_00,local_28);
  }
  google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::MergeFrom
            (&this->phones_,&local_80->phones_);
  local_48 = &local_80->_has_bits_;
  local_4c = 0;
  uVar1 = local_48->has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar4 = _internal_name_abi_cxx11_(local_80);
      _internal_set_name(this,psVar4);
    }
    if ((uVar1 & 2) != 0) {
      psVar4 = _internal_email_abi_cxx11_(local_80);
      _internal_set_email(this,psVar4);
    }
    if ((uVar1 & 4) != 0) {
      this->id_ = local_80->id_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void Person::MergeFrom(const Person& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:Messages.Person)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  phones_.MergeFrom(from.phones_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_email(from._internal_email());
    }
    if (cached_has_bits & 0x00000004u) {
      id_ = from.id_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}